

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

fp fmt::v9::detail::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  int in_EDI;
  fp fVar3;
  int dec_exp_step;
  int first_dec_exp;
  int index;
  int64_t significand;
  int shift;
  undefined1 local_10 [12];
  
  iVar1 = (int)((ulong)((long)(in_EDI + 0x3f) * 0x4d104d42 + 0xffffffff) >> 0x20);
  iVar2 = iVar1 + 0x15b;
  if (iVar2 < 0) {
    iVar2 = iVar1 + 0x162;
  }
  iVar2 = (iVar2 >> 3) + 1;
  *in_RSI = iVar2 * 8 + -0x15c;
  basic_fp<unsigned_long_long>::basic_fp
            ((basic_fp<unsigned_long_long> *)local_10,basic_data<void>::pow10_significands[iVar2],
             (int)basic_data<void>::pow10_exponents[iVar2]);
  fVar3._12_4_ = 0;
  fVar3.f = local_10._0_8_;
  fVar3.e = local_10._8_4_;
  return fVar3;
}

Assistant:

FMT_CONSTEXPR inline fp get_cached_power(int min_exponent,
                                         int& pow10_exponent) {
  const int shift = 32;
  // log10(2) = 0x0.4d104d427de7fbcc...
  const int64_t significand = 0x4d104d427de7fbcc;
  int index = static_cast<int>(
      ((min_exponent + fp::num_significand_bits - 1) * (significand >> shift) +
       ((int64_t(1) << shift) - 1))  // ceil
      >> 32                          // arithmetic shift
  );
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  // Using *(x + index) instead of x[index] avoids an issue with some compilers
  // using the EDG frontend (e.g. nvhpc/22.3 in C++17 mode).
  return {*(data::pow10_significands + index),
          *(data::pow10_exponents + index)};
}